

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_hdwallet.cpp
# Opt level: O0

KeyFormatData *
cfd::core::GetKeyFormatFromVersion(KeyFormatData *__return_storage_ptr__,uint32_t version)

{
  bool bVar1;
  undefined8 uVar2;
  vector<cfd::core::KeyFormatData,_std::allocator<cfd::core::KeyFormatData>_>
  *in_stack_ffffffffffffff48;
  __normal_iterator<cfd::core::KeyFormatData_*,_std::vector<cfd::core::KeyFormatData,_std::allocator<cfd::core::KeyFormatData>_>_>
  *in_stack_ffffffffffffff50;
  allocator *paVar3;
  KeyFormatData *pKVar4;
  CfdError error_code;
  undefined6 in_stack_ffffffffffffff70;
  undefined1 uVar5;
  allocator in_stack_ffffffffffffff77;
  string local_88 [48];
  KeyFormatData *local_58;
  KeyFormatData *format_data;
  KeyFormatData *local_48;
  iterator __end2;
  iterator __begin2;
  vector<cfd::core::KeyFormatData,_std::allocator<cfd::core::KeyFormatData>_> *__range2;
  uint32_t version_local;
  
  pKVar4 = __return_storage_ptr__;
  GetKeyFormatList();
  __end2 = ::std::vector<cfd::core::KeyFormatData,_std::allocator<cfd::core::KeyFormatData>_>::begin
                     (in_stack_ffffffffffffff48);
  local_48 = (KeyFormatData *)
             ::std::vector<cfd::core::KeyFormatData,_std::allocator<cfd::core::KeyFormatData>_>::end
                       (in_stack_ffffffffffffff48);
  do {
    bVar1 = __gnu_cxx::operator!=
                      (in_stack_ffffffffffffff50,
                       (__normal_iterator<cfd::core::KeyFormatData_*,_std::vector<cfd::core::KeyFormatData,_std::allocator<cfd::core::KeyFormatData>_>_>
                        *)in_stack_ffffffffffffff48);
    if (!bVar1) {
      format_data._4_4_ = 2;
LAB_00460aea:
      ::std::vector<cfd::core::KeyFormatData,_std::allocator<cfd::core::KeyFormatData>_>::~vector
                ((vector<cfd::core::KeyFormatData,_std::allocator<cfd::core::KeyFormatData>_> *)
                 __return_storage_ptr__);
      if (format_data._4_4_ != 1) {
        uVar5 = 1;
        uVar2 = __cxa_allocate_exception(0x30);
        error_code = (CfdError)((ulong)pKVar4 >> 0x20);
        paVar3 = (allocator *)&stack0xffffffffffffff77;
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string(local_88,"unsupported extkey version.",paVar3);
        CfdException::CfdException
                  ((CfdException *)
                   CONCAT17(in_stack_ffffffffffffff77,CONCAT16(uVar5,in_stack_ffffffffffffff70)),
                   error_code,(string *)__return_storage_ptr__);
        __cxa_throw(uVar2,&CfdException::typeinfo,CfdException::~CfdException);
      }
      return pKVar4;
    }
    local_58 = __gnu_cxx::
               __normal_iterator<cfd::core::KeyFormatData_*,_std::vector<cfd::core::KeyFormatData,_std::allocator<cfd::core::KeyFormatData>_>_>
               ::operator*(&__end2);
    bVar1 = KeyFormatData::IsFindVersion(local_58,version);
    if (bVar1) {
      KeyFormatData::KeyFormatData(__return_storage_ptr__,local_58);
      format_data._4_4_ = 1;
      goto LAB_00460aea;
    }
    __gnu_cxx::
    __normal_iterator<cfd::core::KeyFormatData_*,_std::vector<cfd::core::KeyFormatData,_std::allocator<cfd::core::KeyFormatData>_>_>
    ::operator++(&__end2);
  } while( true );
}

Assistant:

static KeyFormatData GetKeyFormatFromVersion(uint32_t version) {
  for (const auto& format_data : GetKeyFormatList()) {
    if (format_data.IsFindVersion(version)) {
      return format_data;
    }
  }
  throw CfdException(
      CfdError::kCfdIllegalArgumentError, "unsupported extkey version.");
}